

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FixVariablePS::execute
          (FixVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  undefined8 uVar5;
  bool bVar6;
  VarStatus VVar7;
  long lVar8;
  ulong uVar9;
  int k;
  long lVar10;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_80;
  
  lVar8 = (long)this->m_j;
  if (this->m_correctIdx == true) {
    pnVar3 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[lVar8].m_backend);
    pnVar3 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&pnVar3[this->m_old_j].m_backend,&pnVar3[this->m_j].m_backend);
    lVar8 = (long)this->m_j;
    cStatus->data[this->m_old_j] = cStatus->data[lVar8];
  }
  v = &this->m_val;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&(x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar8].m_backend,&v->m_backend);
  lVar8 = 0;
  for (lVar10 = 0;
      uVar9 = (ulong)(this->m_col).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused, lVar10 < (long)uVar9; lVar10 = lVar10 + 1) {
    local_2b8.fpclass = cpp_dec_float_finite;
    local_2b8.prec_elem = 0x10;
    local_2b8.data._M_elems[0] = 0;
    local_2b8.data._M_elems[1] = 0;
    local_2b8.data._M_elems[2] = 0;
    local_2b8.data._M_elems[3] = 0;
    local_2b8.data._M_elems[4] = 0;
    local_2b8.data._M_elems[5] = 0;
    local_2b8.data._M_elems[6] = 0;
    local_2b8.data._M_elems[7] = 0;
    local_2b8.data._M_elems[8] = 0;
    local_2b8.data._M_elems[9] = 0;
    local_2b8.data._M_elems[10] = 0;
    local_2b8.data._M_elems[0xb] = 0;
    local_2b8.data._M_elems[0xc] = 0;
    local_2b8.data._M_elems[0xd] = 0;
    local_2b8.data._M_elems._56_5_ = 0;
    local_2b8.data._M_elems[0xf]._1_3_ = 0;
    local_2b8.exp = 0;
    local_2b8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_2b8,
               (cpp_dec_float<100U,_int,_void> *)
               ((long)(((this->m_col).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem)->val).m_backend.data._M_elems + lVar8),
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
              (&(s->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(int *)((long)(&((this->m_col).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val + 1) + lVar8)].m_backend,&local_2b8);
    lVar8 = lVar8 + 0x54;
  }
  local_2b8.data._M_elems._0_8_ = *(undefined8 *)(this->m_obj).m_backend.data._M_elems;
  local_2b8.data._M_elems._8_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 2);
  local_2b8.data._M_elems._16_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 4);
  local_2b8.data._M_elems._24_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 6);
  local_2b8.data._M_elems._32_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 8);
  local_2b8.data._M_elems._40_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 10);
  local_2b8.data._M_elems._48_8_ = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xc);
  uVar5 = *(undefined8 *)((this->m_obj).m_backend.data._M_elems + 0xe);
  local_2b8.data._M_elems._56_5_ = SUB85(uVar5,0);
  local_2b8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  local_2b8.exp = (this->m_obj).m_backend.exp;
  local_2b8.neg = (this->m_obj).m_backend.neg;
  local_2b8.fpclass = (this->m_obj).m_backend.fpclass;
  local_2b8.prec_elem = (this->m_obj).m_backend.prec_elem;
  lVar8 = 0;
  for (lVar10 = 0; lVar10 < (int)uVar9; lVar10 = lVar10 + 1) {
    pNVar4 = (this->m_col).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 0x10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems[6] = 0;
    local_268.data._M_elems[7] = 0;
    local_268.data._M_elems[8] = 0;
    local_268.data._M_elems[9] = 0;
    local_268.data._M_elems[10] = 0;
    local_268.data._M_elems[0xb] = 0;
    local_268.data._M_elems[0xc] = 0;
    local_268.data._M_elems[0xd] = 0;
    local_268.data._M_elems._56_5_ = 0;
    local_268.data._M_elems[0xf]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_268,
               (cpp_dec_float<100U,_int,_void> *)
               ((long)(pNVar4->val).m_backend.data._M_elems + lVar8),
               &(y->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [*(int *)((long)(&pNVar4->val + 1) + lVar8)].m_backend);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
              (&local_2b8,&local_268);
    uVar9 = (ulong)(uint)(this->m_col).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
    lVar8 = lVar8 + 0x54;
  }
  iVar2 = this->m_j;
  pnVar3 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_2b8.data._M_elems._48_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(local_2b8.data._M_elems[0xf]._1_3_,local_2b8.data._M_elems._56_5_);
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = local_2b8.data._M_elems._32_8_;
  *(undefined8 *)(puVar1 + 2) = local_2b8.data._M_elems._40_8_;
  puVar1 = pnVar3[iVar2].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_2b8.data._M_elems._16_8_;
  *(undefined8 *)(puVar1 + 2) = local_2b8.data._M_elems._24_8_;
  *(undefined8 *)&pnVar3[iVar2].m_backend.data = local_2b8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar3[iVar2].m_backend.data._M_elems + 2) = local_2b8.data._M_elems._8_8_;
  pnVar3[iVar2].m_backend.exp = local_2b8.exp;
  pnVar3[iVar2].m_backend.neg = local_2b8.neg;
  pnVar3[iVar2].m_backend.fpclass = local_2b8.fpclass;
  pnVar3[iVar2].m_backend.prec_elem = local_2b8.prec_elem;
  bVar6 = boost::multiprecision::operator==(&this->m_lower,&this->m_upper);
  if (bVar6) {
    VVar7 = FIXED;
  }
  else {
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->m_val).m_backend.data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xe);
    local_128.m_backend.exp = (this->m_val).m_backend.exp;
    local_128.m_backend.neg = (this->m_val).m_backend.neg;
    local_128.m_backend.fpclass = (this->m_val).m_backend.fpclass;
    local_128.m_backend.prec_elem = (this->m_val).m_backend.prec_elem;
    local_178.m_backend.data._M_elems[0] = (this->m_lower).m_backend.data._M_elems[0];
    local_178.m_backend.data._M_elems[1] = (this->m_lower).m_backend.data._M_elems[1];
    local_178.m_backend.data._M_elems[2] = (this->m_lower).m_backend.data._M_elems[2];
    local_178.m_backend.data._M_elems[3] = (this->m_lower).m_backend.data._M_elems[3];
    local_178.m_backend.data._M_elems[4] = (this->m_lower).m_backend.data._M_elems[4];
    local_178.m_backend.data._M_elems[5] = (this->m_lower).m_backend.data._M_elems[5];
    local_178.m_backend.data._M_elems[6] = (this->m_lower).m_backend.data._M_elems[6];
    local_178.m_backend.data._M_elems[7] = (this->m_lower).m_backend.data._M_elems[7];
    local_178.m_backend.data._M_elems[8] = (this->m_lower).m_backend.data._M_elems[8];
    local_178.m_backend.data._M_elems[9] = (this->m_lower).m_backend.data._M_elems[9];
    local_178.m_backend.data._M_elems[10] = (this->m_lower).m_backend.data._M_elems[10];
    local_178.m_backend.data._M_elems[0xb] = (this->m_lower).m_backend.data._M_elems[0xb];
    local_178.m_backend.data._M_elems[0xc] = (this->m_lower).m_backend.data._M_elems[0xc];
    local_178.m_backend.data._M_elems[0xd] = (this->m_lower).m_backend.data._M_elems[0xd];
    local_178.m_backend.data._M_elems[0xe] = (this->m_lower).m_backend.data._M_elems[0xe];
    local_178.m_backend.data._M_elems[0xf] = (this->m_lower).m_backend.data._M_elems[0xf];
    local_178.m_backend.exp = (this->m_lower).m_backend.exp;
    local_178.m_backend.neg = (this->m_lower).m_backend.neg;
    local_178.m_backend.fpclass = (this->m_lower).m_backend.fpclass;
    local_178.m_backend.prec_elem = (this->m_lower).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_80,this);
    bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_128,&local_178,&local_80);
    if (bVar6) {
      VVar7 = ON_LOWER;
    }
    else {
      local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->m_backend).data._M_elems;
      local_1c8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_val).m_backend.data._M_elems + 2);
      local_1c8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_val).m_backend.data._M_elems + 4);
      local_1c8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->m_val).m_backend.data._M_elems + 6);
      local_1c8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_val).m_backend.data._M_elems + 8);
      local_1c8.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((this->m_val).m_backend.data._M_elems + 10);
      local_1c8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xc);
      local_1c8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((this->m_val).m_backend.data._M_elems + 0xe);
      local_1c8.m_backend.exp = (this->m_val).m_backend.exp;
      local_1c8.m_backend.neg = (this->m_val).m_backend.neg;
      local_1c8.m_backend.fpclass = (this->m_val).m_backend.fpclass;
      local_1c8.m_backend.prec_elem = (this->m_val).m_backend.prec_elem;
      local_218.m_backend.data._M_elems[0] = (this->m_upper).m_backend.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = (this->m_upper).m_backend.data._M_elems[1];
      local_218.m_backend.data._M_elems[2] = (this->m_upper).m_backend.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = (this->m_upper).m_backend.data._M_elems[3];
      local_218.m_backend.data._M_elems[4] = (this->m_upper).m_backend.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = (this->m_upper).m_backend.data._M_elems[5];
      local_218.m_backend.data._M_elems[6] = (this->m_upper).m_backend.data._M_elems[6];
      local_218.m_backend.data._M_elems[7] = (this->m_upper).m_backend.data._M_elems[7];
      local_218.m_backend.data._M_elems[8] = (this->m_upper).m_backend.data._M_elems[8];
      local_218.m_backend.data._M_elems[9] = (this->m_upper).m_backend.data._M_elems[9];
      local_218.m_backend.data._M_elems[10] = (this->m_upper).m_backend.data._M_elems[10];
      local_218.m_backend.data._M_elems[0xb] = (this->m_upper).m_backend.data._M_elems[0xb];
      local_218.m_backend.data._M_elems[0xc] = (this->m_upper).m_backend.data._M_elems[0xc];
      local_218.m_backend.data._M_elems[0xd] = (this->m_upper).m_backend.data._M_elems[0xd];
      local_218.m_backend.data._M_elems[0xe] = (this->m_upper).m_backend.data._M_elems[0xe];
      local_218.m_backend.data._M_elems[0xf] = (this->m_upper).m_backend.data._M_elems[0xf];
      local_218.m_backend.exp = (this->m_upper).m_backend.exp;
      local_218.m_backend.neg = (this->m_upper).m_backend.neg;
      local_218.m_backend.fpclass = (this->m_upper).m_backend.fpclass;
      local_218.m_backend.prec_elem = (this->m_upper).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_d0,this);
      bVar6 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1c8,&local_218,&local_d0);
      VVar7 = (uint)!bVar6 + (uint)!bVar6 * 2;
    }
  }
  cStatus->data[this->m_j] = VVar7;
  return;
}

Assistant:

void SPxMainSM<R>::FixVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // update the index mapping; if m_correctIdx is false, we assume that this has happened already
   if(m_correctIdx)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   x[m_j] = m_val;

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] += m_col.value(k) * x[m_j];

   // dual:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
      val -= m_col.value(k) * y[m_col.index(k)];

   r[m_j] = val;

   // basis:
   if(m_lower == m_upper)
   {
      assert(EQrel(m_lower, m_val, this->epsilon()));

      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else
   {
      assert(EQrel(m_val, m_lower, this->epsilon()) || EQrel(m_val, m_upper, this->epsilon())
             || m_val == 0.0);

      cStatus[m_j] = EQrel(m_val, m_lower, this->epsilon()) ? SPxSolverBase<R>::ON_LOWER : (EQrel(m_val,
                     m_upper, this->epsilon()) ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ZERO);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(m_correctIdx)
   {
      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM19 Dimension doesn't match after this step.");
      }
   }

#endif
}